

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O3

Score Search::search<(Nodetype)0>(position *pos,int16 alpha,int16 beta,U16 depth,node *stack)

{
  int *piVar1;
  Searchthread *t;
  pointer pRVar2;
  char *pcVar3;
  double dVar4;
  Score SVar5;
  U8 UVar6;
  U8 UVar7;
  node *pnVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  ushort uVar14;
  U16 depth_00;
  int iVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ostream *poVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined7 extraout_var;
  uint uVar21;
  undefined6 in_register_0000000a;
  value_type *__x;
  undefined8 extraout_RDX;
  Move *m;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar22;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined7 uVar23;
  node *pnVar24;
  short sVar25;
  Score SVar26;
  short sVar27;
  uint uVar28;
  byte bVar29;
  bool skipQuiets;
  Score SVar30;
  ulong uVar31;
  bool bVar32;
  float __x_00;
  Move move;
  Move local_262;
  Move local_25f;
  int local_25c;
  uint local_258;
  undefined4 local_254;
  node *local_250;
  int local_248;
  U8 local_241;
  char local_240;
  byte local_23f;
  byte local_23e;
  bool pvNode;
  Score local_23c;
  undefined4 local_238;
  Score local_234;
  Score local_230;
  Score local_22c;
  Move local_226;
  Move local_223;
  Rootmove *local_220;
  Score bestScore;
  value_type *local_210;
  ulong local_208;
  undefined4 local_200;
  uint local_1fc;
  Score ttvalue;
  U8 local_1f3;
  U8 local_1f2;
  U8 local_1f1;
  node *local_1f0;
  int local_1e4;
  undefined4 local_1e0;
  Score local_1dc;
  Score local_1d8;
  uint local_1d4;
  Score local_1d0;
  int16 local_1ca;
  string local_1c8;
  vector<Move,_std::allocator<Move>_> quiets;
  Moveorder mvs;
  Move pv [68];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  
  if (UCI_SIGNALS.stop) {
    return draw;
  }
  local_250 = stack;
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DoubleEspresso[P]chess/src/search.hpp"
                  ,0x139,"Score Search::search(position &, int16, int16, U16, node *) [type = root]"
                 );
  }
  local_258 = (uint)CONCAT62(in_register_0000000a,depth);
  SVar26 = (Score)alpha;
  bestScore = ninf;
  local_25f.f = '\0';
  local_25f.t = '\0';
  local_25f.type = '\x11';
  local_262.f = '\0';
  local_262.t = '\0';
  local_262.type = '\x11';
  lVar17 = 2;
  do {
    *(undefined2 *)((long)pv + lVar17 + -2) = 0;
    (&pv[0].f)[lVar17] = '\x11';
    lVar17 = lVar17 + 3;
  } while (lVar17 != 0xce);
  ttvalue = ninf;
  bVar9 = position::in_check(pos);
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_250->in_check = bVar9;
  local_25c = *(int *)(local_250 + -1);
  local_250->ply = (U16)(local_25c + 1U);
  uVar21 = local_25c + 1U & 0xffff;
  pvNode = (short)local_25c == 0;
  if (pvNode) {
    if ((selDepth <= (int)uVar21) && (pos->thread_id == 0)) {
      selDepth = selDepth + 1;
    }
  }
  else if (!bVar9) {
    bVar10 = position::is_draw(pos);
    SVar30 = draw;
    if (bVar10) goto LAB_00129477;
  }
  SVar30 = mate - uVar21;
  SVar5 = (int)beta;
  if (SVar30 < beta) {
    SVar5 = SVar30;
  }
  if (SVar30 <= SVar26) goto LAB_00129477;
  SVar30 = uVar21 + mated;
  local_22c = SVar26;
  if (SVar26 < SVar30) {
    local_22c = SVar30;
  }
  sVar25 = (short)SVar5;
  SVar26 = (Score)sVar25;
  if (SVar26 <= SVar30) goto LAB_00129477;
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
       '\0';
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
       '\0';
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_1_ =
       '\x11';
  local_1c8._M_dataplus._M_p = (pointer)(pos->ifo).key;
  local_1d0 = SVar30;
  bVar10 = hash_table::fetch(&ttable,(U64 *)&local_1c8,(hash_data *)&mvs);
  SVar30 = ninf;
  uVar18 = (ulong)(ushort)local_258;
  local_208._0_4_ = local_258 & 0xffff;
  local_208 = uVar18;
  if (bVar10) {
    hashHits = hashHits + 1;
    local_262 = mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._2_3_;
    SVar30 = (Score)mvs._vptr_Moveorder._4_2_;
    ttvalue = SVar30;
    if (((ushort)local_25c != 0) && ((int)(uint)local_208 <= (int)(char)mvs._vptr_Moveorder)) {
      if (SVar30 < SVar26) {
        if (mvs._vptr_Moveorder._1_1_ == '\x01') {
LAB_001287c5:
          local_1c8._M_dataplus._M_p._0_2_ = (ushort)local_258;
          haVoc::Movehistory::update
                    (&pos->stats,pos,&local_262,&local_250[-1].curr_move,(int16 *)&local_1c8,
                     &ttvalue,&quiets,local_250->killers);
          SVar30 = ttvalue;
          goto LAB_00129477;
        }
      }
      else if (mvs._vptr_Moveorder._1_1_ == '\0') goto LAB_001287c5;
    }
  }
  bVar10 = (DAT_00141b78 & (pos->pcs).bitmap._M_elems[1]._M_elems[0]) != 0;
  bVar32 = (DAT_00141ba0 & (pos->pcs).bitmap._M_elems[0]._M_elems[0]) != 0;
  local_248 = CONCAT31(local_248._1_3_,bVar10 || bVar32);
  local_230 = SVar26;
  if (SVar30 == ninf) {
    SVar30 = local_250[-2].static_eval;
    if ((SVar30 != ninf && !bVar9) && (local_250[-1].static_eval <= SVar30)) {
      SVar30 = SVar30 + 0xf;
      goto LAB_001288b6;
    }
    if (!bVar9) {
      t = SearchThreads.workers.super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>.
          _M_impl.super__Vector_impl_data._M_start[pos->thread_id];
      if (bVar10 || bVar32) {
        mvs._vptr_Moveorder._0_4_ = -1.0;
      }
      else {
        dVar4 = (double)(uint)local_208;
        dVar4 = exp((dVar4 + -64.0) / 20.0);
        mvs._vptr_Moveorder._0_4_ = (float)((1.0 - dVar4) * 225.0);
      }
      __x_00 = eval::evaluate(pos,t,(float *)&mvs);
      lVar17 = lroundf(__x_00);
      SVar30 = (Score)lVar17;
      local_250->static_eval = SVar30;
      goto LAB_00128924;
    }
    local_250->static_eval = ninf;
    SVar30 = ninf;
LAB_00128941:
    bVar10 = false;
  }
  else {
LAB_001288b6:
    local_250->static_eval = SVar30;
    if (bVar9) goto LAB_00128941;
LAB_00128924:
    if ((((ushort)local_25c == 0) || (local_250[-1].curr_move.type != '\n')) ||
       (local_250->null_search != false)) goto LAB_00128941;
    bVar10 = (((short)(undefined2)local_22c - local_230) + 1U & 0xfffffffdU) == 0 && SVar30 != ninf;
  }
  pnVar8 = local_250;
  bVar32 = (pos->ifo).stm != white;
  if (((bVar10) && (5 < (ushort)local_258)) &&
     (((((pos->pcs).bitmap._M_elems[bVar32]._M_elems[2] != 0 ||
        (pos->pcs).bitmap._M_elems[bVar32]._M_elems[1] != 0) ||
       (pos->pcs).bitmap._M_elems[bVar32]._M_elems[3] != 0) ||
       (pos->pcs).bitmap._M_elems[bVar32]._M_elems[4] != 0 &&
      (local_230 <= SVar30 + (int)local_208 * 8 + 0xfffffe00)))) {
    local_250[1].null_search = true;
    position::do_null_move(pos);
    depth_00 = (short)local_258 - (short)(local_208 >> 1);
    if ((short)depth_00 < 2) {
      SVar26 = qsearch<(Nodetype)2>(pos,-sVar25,1 - sVar25,0,pnVar8 + 1);
    }
    else {
      SVar26 = search<(Nodetype)2>(pos,-sVar25,1 - sVar25,depth_00,pnVar8 + 1);
    }
    position::undo_null_move(pos);
    SVar30 = -SVar26;
    local_250[1].null_search = false;
    if (local_230 == SVar30 || SBORROW4(local_230,SVar30) != local_230 + SVar26 < 0) {
LAB_00129477:
      if (quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return SVar30;
    }
    if ((local_250[1].best_move.type == '\v') && (499 < SVar26 + local_230)) {
      UVar6 = local_250[1].best_move.t;
      (local_250->threat_move).f = local_250[1].best_move.f;
      (local_250->threat_move).t = UVar6;
      (local_250->threat_move).type = '\v';
    }
  }
  pnVar8 = local_250;
  haVoc::Moveorder::Moveorder(&mvs,pos,&local_262,local_250);
  move.f = '\0';
  move.t = '\0';
  move.type = '\x11';
  local_223.f = pnVar8[-1].curr_move.f;
  local_223.t = pnVar8[-1].curr_move.t;
  local_223.type = pnVar8[-1].curr_move.type;
  local_226.f = pnVar8[-2].curr_move.f;
  local_226.t = pnVar8[-2].curr_move.t;
  local_226.type = pnVar8[-2].curr_move.type;
  if ((ushort)local_25c == 0) {
    pRVar2 = (pos->root_moves).super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar18 = ((long)*(pointer *)
                     ((long)&(pRVar2->pv).super__Vector_base<Move,_std::allocator<Move>_>._M_impl +
                     8) -
             *(long *)&(pRVar2->pv).super__Vector_base<Move,_std::allocator<Move>_>._M_impl) *
             -0x5555555555555555;
    local_1e0 = (undefined4)CONCAT71((int7)(uVar18 >> 8),4 < uVar18);
  }
  else {
    local_1e0 = 0;
  }
  uVar18 = (ulong)(pos->ifo).stm;
  local_1d8 = pnVar8[-2].static_eval;
  local_1dc = pnVar8->static_eval;
  uVar21 = (uint)(pos->ifo).key & 0x3ff;
  if (searching_positions[uVar21].searching == false) {
    uVar14 = pos->thread_id;
    searching_positions[uVar21].searching = true;
    searching_positions[uVar21].id = (uint)uVar14;
  }
  bVar10 = local_1d8 <= local_1dc;
  bVar32 = (ushort)local_25c == 0;
  uVar28 = (uint)local_208;
  local_1d4 = uVar28 * uVar28 + 6 >> (local_1dc < local_1d8);
  local_1f0 = pnVar8 + 1;
  local_23f = (ushort)local_258 < 3 | (byte)local_248;
  uVar21 = 0x3f;
  if (uVar28 < 0x3f) {
    uVar21 = uVar28;
  }
  sVar25 = -sVar25;
  SVar26 = ninf;
  skipQuiets = false;
  local_248 = 0;
  pnVar24 = pnVar8;
  do {
    local_23c = (Score)(short)local_22c;
    local_1e4 = -local_22c;
    local_22c = ~local_22c;
    local_234 = SVar26;
    do {
      local_23e = local_234 < local_23c && (ushort)local_258 < 2;
      local_240 = mated_max_ply < local_234 && local_234 < local_23c;
      do {
        local_220 = (Rootmove *)(ulong)(ushort)local_248;
        local_210 = (value_type *)(CONCAT71(local_210._1_7_,1 < (ushort)local_248 & local_23e) ^ 1);
        do {
          do {
            bVar11 = haVoc::Moveorder::next_move
                               (&mvs,pos,&move,&local_223,&local_226,&pnVar8->threat_move,skipQuiets
                                ,local_1e0._0_1_);
            if (!bVar11) goto LAB_0012936b;
            if (UCI_SIGNALS.stop != false) goto LAB_00129236;
          } while ((move.type == '\x11') || (bVar11 = position::is_legal(pos,&move), !bVar11));
          uVar14 = pos->thread_id | (ushort)local_25c;
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ulong)uVar14;
          uVar22 = extraout_RDX;
          if ((uVar14 == 0) && (3000.0 < elapsed)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"info depth ",0xb);
            poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20," currmove ",10);
            uci::move_to_string_abi_cxx11_(&local_1c8,(uci *)&move,m);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20," currmovenumber ",0x10);
            poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
            std::ostream::put((char)poVar20);
            std::ostream::flush();
            paVar19 = &local_1c8.field_2;
            uVar22 = extraout_RDX_00;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != paVar19) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
              paVar19 = extraout_RAX;
              uVar22 = extraout_RDX_01;
            }
          }
          if ((move.f == local_262.f) && (move.t == local_262.t)) {
            uVar22 = CONCAT71((int7)((ulong)uVar22 >> 8),1);
            local_254 = (undefined4)uVar22;
            if (move.type != local_262.type) goto LAB_00128d0c;
          }
          else {
LAB_00128d0c:
            if ((move.f == pnVar8->killers[0].f) && (move.t == pnVar24->killers[0].t)) {
              uVar22 = CONCAT71((int7)((ulong)uVar22 >> 8),1);
              local_254 = (undefined4)uVar22;
              if (move.type == pnVar24->killers[0].type) goto LAB_00128d90;
            }
            if ((move.f == pnVar24->killers[1].f) && (move.t == pnVar24->killers[1].t)) {
              uVar22 = CONCAT71((int7)((ulong)uVar22 >> 8),1);
              local_254 = (undefined4)uVar22;
              if (move.type == pnVar24->killers[1].type) goto LAB_00128d90;
            }
            if (((move.f != pnVar24->killers[2].f) || (move.t != pnVar24->killers[2].t)) ||
               (local_254 = (undefined4)CONCAT71((int7)((ulong)uVar22 >> 8),1),
               move.type != pnVar24->killers[2].type)) {
              if ((move.f == pnVar24->killers[3].f) && (move.t == pnVar24->killers[3].t)) {
                local_254 = (undefined4)
                            CONCAT71((int7)((ulong)paVar19 >> 8),
                                     move.type == pnVar24->killers[3].type);
              }
              else {
                local_254 = 0;
              }
            }
          }
LAB_00128d90:
          bVar11 = position::is_promotion(pos,&move.type);
          bVar12 = true;
          uVar22 = extraout_RDX_02;
          if (1 < (byte)(move.type - 0xb)) {
            local_1c8._M_dataplus._M_p._0_4_ = (uint)move.type;
            bVar12 = position::is_cap_promotion(pos,(Movetype *)&local_1c8);
            uVar22 = extraout_RDX_03;
          }
          if ((pos->pcs).piece_on._M_elems[move.t] == pawn) {
            uVar23 = (undefined7)((ulong)uVar22 >> 8);
            if (uVar18 == 0) {
              local_238 = (undefined4)CONCAT71(uVar23,0x27 < move.t);
            }
            else {
              local_238 = (undefined4)CONCAT71(uVar23,move.t < 0x18);
            }
          }
          else {
            local_238 = 0;
          }
          if ((pnVar24->threat_move).type == '\x11') {
            local_1fc = 0;
          }
          else {
            local_1fc = (uint)(byte)((pnVar8->threat_move).f == move.t & bVar12);
          }
          local_241 = pnVar24[-1].curr_move.type;
          if (move.type == '\n') {
            bVar13 = position::quiet_gives_dangerous_check(pos,&move);
            local_200 = (undefined4)CONCAT71(extraout_var,bVar13);
          }
          else {
            local_200 = 0;
          }
        } while (((((!bVar9 && !bVar11) && (char)local_254 == '\0') &&
                   (bVar12 == true && (ushort)local_25c != 0)) && ((byte)local_210 == '\0')) &&
                (iVar15 = position::see(pos,&move), iVar15 < 0));
        local_210 = (value_type *)CONCAT71(local_210._1_7_,local_241 == '\v');
        position::do_move(pos,&move);
        (pnVar24->curr_move).f = move.f;
        (pnVar24->curr_move).t = move.t;
        (pnVar24->curr_move).type = move.type;
        bVar13 = position::in_check(pos);
        bVar29 = (byte)local_254;
        if ((ushort)local_25c == 0) {
          uVar14 = 0xffff;
          uVar28 = (uint)bVar13;
        }
        else {
          uVar14 = (byte)((((bVar9 || bVar13) || bVar11) || local_23c < local_234) |
                         local_1d8 <= local_1dc | bVar12 |
                         bVar29 | (byte)local_238 | 2 < (ushort)local_258) | 0xfffe;
          uVar28 = (uint)bVar13;
          if ((local_1dc < local_1d8) &&
             (uVar28 = (uint)bVar13, (bVar29 == 0 && bVar12 == false) && 2 >= (ushort)local_258)) {
            uVar28 = bVar13 + 1;
            if ((((byte)local_238 | (byte)local_200 | (byte)local_1fc) & 1) == 0) {
              uVar28 = (uint)bVar13;
            }
            if (local_240 == '\0') {
              uVar28 = (uint)bVar13;
            }
          }
        }
        skipQuiets = local_1d4 <= (uint)local_220;
        uVar28 = uVar28 + (int)(short)uVar14 + local_258;
        pnVar24[1].pv = (Move *)0x0;
        sVar27 = (short)uVar28;
        if ((ushort)local_220 < 3) {
          pnVar24[1].pv = pv;
          pv[0].f = '\0';
          pv[0].t = '\0';
          pv[0].type = '\x11';
          if (sVar27 < 2) {
            SVar26 = qsearch<(Nodetype)1>(pos,sVar25,(int16)local_1e4,0,local_1f0);
          }
          else {
            SVar26 = search<(Nodetype)1>(pos,sVar25,(int16)local_1e4,sVar27 - 1,local_1f0);
          }
LAB_001290f8:
          SVar26 = -SVar26;
        }
        else {
          uVar16 = uVar28;
          if ((((bVar11 | (byte)local_238 | bVar29 | (byte)local_1fc | (byte)local_200 | bVar9 |
                 bVar13 | local_23f) & 1) == 0 && (bVar12 & (byte)local_210) == 0) &&
             (local_234 <= local_23c)) {
            uVar31 = (ulong)local_220 & 0xffffffff;
            if (0x3e < (uint)local_220) {
              uVar31 = 0x3f;
            }
            uVar16 = (uint)(ushort)(sVar27 - *(short *)((long)&bitboards::reductions +
                                                       uVar31 * 4 +
                                                       (ulong)(uVar21 << 8) + (ulong)bVar10 * 0x4000
                                                       + (ulong)bVar32 * 0x8000));
          }
          local_220 = (Rootmove *)CONCAT44(local_220._4_4_,uVar28);
          local_210 = (value_type *)CONCAT44(local_210._4_4_,(int)(int16)local_1e4);
          if ((short)uVar16 < 2) {
            SVar26 = qsearch<(Nodetype)2>(pos,(undefined2)local_22c,(int16)local_1e4,0,local_1f0);
          }
          else {
            SVar26 = search<(Nodetype)2>(pos,(undefined2)local_22c,(int16)local_1e4,
                                         (short)uVar16 - 1,local_1f0);
          }
          SVar26 = -SVar26;
          if (local_23c < SVar26) {
            pnVar24[1].pv = pv;
            pv[0].f = '\0';
            pv[0].t = '\0';
            pv[0].type = '\x11';
            if ((short)local_220 < 2) {
              SVar26 = qsearch<(Nodetype)1>(pos,sVar25,(int16)local_210,0,local_1f0);
            }
            else {
              SVar26 = search<(Nodetype)1>(pos,sVar25,(int16)local_210,(short)local_220 - 1,
                                           local_1f0);
            }
            goto LAB_001290f8;
          }
        }
        if (move.type == '\n') {
          std::vector<Move,std::allocator<Move>>::emplace_back<Move&>
                    ((vector<Move,std::allocator<Move>> *)&quiets,&move);
        }
        position::undo_move(pos,&move);
        if (UCI_SIGNALS.stop != false) {
LAB_00129236:
          SVar30 = draw;
          goto LAB_0012946a;
        }
        if ((ushort)local_25c == 0) {
          local_220 = (Rootmove *)
                      std::
                      __find_if<__gnu_cxx::__normal_iterator<Rootmove*,std::vector<Rootmove,std::allocator<Rootmove>>>,__gnu_cxx::__ops::_Iter_equals_val<Move_const>>
                                ((pos->root_moves).
                                 super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
                                 super__Vector_impl_data._M_start,
                                 (pos->root_moves).
                                 super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&move);
          if (((ushort)local_248 == 0) || (local_23c < SVar26)) {
            local_220->score = SVar26;
            local_220->selDepth = selDepth;
            std::vector<Move,_std::allocator<Move>_>::resize
                      ((vector<Move,_std::allocator<Move>_> *)local_220,1);
            __x = pnVar24[1].pv;
            if (__x->f != __x->t) {
              do {
                if (__x->type == '\x11') break;
                local_210 = __x;
                std::vector<Move,_std::allocator<Move>_>::push_back(&local_220->pv,__x);
                __x = local_210 + 1;
              } while (local_210[1].f != local_210[1].t);
            }
          }
          else {
            local_220->score = ninf;
          }
        }
        local_248 = local_248 + 1;
      } while (SVar26 <= local_234);
      UVar6 = move.f;
      UVar7 = move.t;
      local_25f.f = move.f;
      local_25f.t = move.t;
      local_25f.type = move.type;
      (pnVar24->best_move).f = UVar6;
      (pnVar24->best_move).t = UVar7;
      (pnVar24->best_move).type = move.type;
      bestScore = SVar26;
      if (local_230 <= SVar26) {
        local_1c8._M_dataplus._M_p._0_2_ = (short)local_258;
        haVoc::Movehistory::update
                  (&pos->stats,pos,&local_25f,&pnVar8[-1].curr_move,(int16 *)&local_1c8,&bestScore,
                   &quiets,pnVar8->killers);
        local_234 = bestScore;
        pnVar24 = local_250;
LAB_0012936b:
        pcVar3 = (char *)(pos->ifo).key;
        uVar21 = (uint)pcVar3 & 0x3ff;
        searching_positions[uVar21].searching = false;
        searching_positions[uVar21].id = -1;
        if ((local_23c <= local_234) && (local_234 < local_230)) {
          if (local_25f.f != local_25f.t) {
            piVar1 = pnVar24->bestMoveHistory->bm[uVar18][local_25f.f] + local_25f.t;
            *piVar1 = *piVar1 + (int)local_208 * 2;
          }
        }
        if ((ushort)local_248 == 0) {
          SVar30 = draw;
          if (bVar9) {
            SVar30 = local_1d0;
          }
        }
        else {
          local_1f2 = (local_25f.type != '\x11' && (ushort)local_25c == 0) + '\x01';
          if (local_230 <= local_234) {
            local_1f2 = '\0';
          }
          local_1f1 = (U8)local_258;
          local_1f3 = (U8)pnVar24->ply;
          local_1ca = (int16)local_234;
          local_1c8._M_dataplus._M_p = pcVar3;
          hash_table::save(&ttable,(U64 *)&local_1c8,&local_1f1,&local_1f2,&local_1f3,&local_25f,
                           &local_1ca,&pvNode);
          SVar30 = bestScore;
        }
LAB_0012946a:
        haVoc::Moveorder::~Moveorder(&mvs);
        goto LAB_00129477;
      }
      pnVar24 = local_250;
      local_234 = SVar26;
    } while (SVar26 <= local_23c);
    local_22c = local_23c;
    if ((ushort)local_25c == 0) {
      local_22c = SVar26;
    }
  } while( true );
}

Assistant:

Score Search::search(position& pos, int16 alpha, int16 beta, U16 depth, node* stack) {

	if (UCI_SIGNALS.stop)
		return Score::draw;

	assert(alpha < beta);

	Score bestScore = Score::ninf;
	Move best_move = {};
	best_move.type = Movetype::no_type;
	size_t deferred = 0;

	Move ttm = {}; ttm.type = Movetype::no_type; // refactor me
	Move pv[Depth::MAX_PLY + 4];
	Score ttvalue = Score::ninf;

	bool in_check = pos.in_check();
	std::vector<Move> quiets;
	stack->in_check = in_check;
	stack->ply = (stack - 1)->ply + 1;


	U16 root_dist = stack->ply;
	const bool root_node = (type == Nodetype::root && stack->ply == 1);
	const bool pvNode = (root_node || type == Nodetype::pv);
	if (pvNode && selDepth < stack->ply + 1 && main_thread(pos))
		selDepth++;

	if (!root_node && !in_check && pos.is_draw())
			return Score::draw;

	{ // mate distance pruning
		Score mating_score = Score(Score::mate - root_dist);
		beta = std::min(mating_score, Score(beta));
		if (alpha >= mating_score)
			return mating_score;

		Score mated_score = Score(Score::mated + root_dist);
		alpha = std::max(mated_score, Score(alpha));
		if (beta <= mated_score)
			return mated_score;
	}

	// hashtable lookup
	auto hashHit = false;
	{
		hash_data e;
		hashHit = ttable.fetch(pos.key(), e);
		if (hashHit) {
			ttm = e.move;
			hashHits++;
			ttvalue = Score(e.score);
			if (!pvNode &&
				e.depth >= depth &&
				(ttvalue >= beta ? e.bound == bound_low : e.bound == bound_high)) {
				pos.stats_update(ttm, (stack - 1)->curr_move, depth, ttvalue, quiets, stack->killers);
				return ttvalue;
			}
		}
	}

	// static evaluation
	const bool anyPawnsOn7th = pos.pawns_near_promotion(); // either side has pawns on 7th
	const bool weHavePawnsOn7th = pos.pawns_on_7th(); // only side to move has pawns on 7th

	Score static_eval = (ttvalue != Score::ninf ? ttvalue :
		(stack-2)->static_eval != ninf && !in_check && (stack-2)->static_eval >= (stack-1)->static_eval ? Score((stack-2)->static_eval + 15) :
		!in_check ? 
		Score(std::lround(eval::evaluate(pos, *SearchThreads[pos.id()], lazy_eval_margin_search(depth, anyPawnsOn7th)))) :
		Score::ninf);
	 
	//Score static_eval = Score::ninf;
	//if (ttvalue == Score::ninf &&
	//	!pvNode && 
	//	!in_check && 
	//	(stack - 2)->static_eval != Score::ninf &&
	//	(stack - 1)->best_move.type == Movetype::quiet)
	//	static_eval = Score((stack - 2)->static_eval + 33);
	//else if (!in_check)
	//	static_eval = Score(std::lround(eval::evaluate(pos, *SearchThreads[pos.id()], lazy_eval_margin_search(depth, anyPawnsOn7th))));
	stack->static_eval = static_eval;
	bool hasStaticValue = static_eval != Score::ninf;


	// 0. Define the forward pruning conditions
	const bool forward_prune =
		(!in_check &&
		!pvNode &&
		(stack - 1)->curr_move.type == Movetype::quiet &&
		!stack->null_search &&
		abs(alpha - beta) == 1 && // only prune in null windows (same condition as !pv_node)
		hasStaticValue);

	// 1. Futility pruning
	//if (forward_prune &&
	//	!weHavePawnsOn7th &&
	//	depth <= 1 &&
	//	static_eval > mated_max_ply &&
	//	static_eval + 1150 < alpha)
	//	return Score(static_eval);

	// 2. Null move pruning
	bool null_move_allowed = (pos.to_move() == white ?
		pos.non_pawn_material<white>() :
		pos.non_pawn_material<black>());
	if (forward_prune &&
		null_move_allowed &&
		depth >= 6 &&
		static_eval - 8 * (64 - depth) >= beta) {

		int16 R = (depth >= 6 ? depth / 2 : 2);
		int16 ndepth = depth - R;

		(stack + 1)->null_search = true;
		pos.do_null_move();
		Score null_eval = Score(ndepth <= 1 ?
			-qsearch<non_pv>(pos, -beta, -beta + 1, 0, stack + 1) :
			-search<non_pv>(pos, -beta, -beta + 1, ndepth, stack + 1));
		pos.undo_null_move();
		(stack + 1)->null_search = false;


		// verification
		//null_eval = Score(ndepth <= 1 ?
		//	qsearch<non_pv>(pos, beta-1, beta, 0, stack) :
		//	search<non_pv>(pos, beta-1, beta, ndepth, stack));

		if (null_eval >= beta)
			return Score(null_eval);
		else {
			Move tm = (stack + 1)->best_move;
			if (tm.type == Movetype::capture && beta - null_eval >= 500)
				stack->threat_move = tm;
		}
	}

	// Main search
	U16 moves_searched = 0;
	haVoc::Moveorder mvs(pos, ttm, stack);
	Move move;
	Move pre_move = (stack - 1)->curr_move;
	Move pre_pre_move = (stack - 2)->curr_move;
	bool improving = stack->static_eval - (stack - 2)->static_eval >= 0;
	auto to_mv = pos.to_move();
	int SEE = 0;
	auto skipQuiets = false;
	auto rootMoves = root_node && pos.root_moves[0].pv.size() > 4;

	set_searching(pos, {}, pos.id());

	while (mvs.next_move(pos, move, pre_move, pre_pre_move, stack->threat_move, skipQuiets, rootMoves)) {

		if (UCI_SIGNALS.stop)
			return Score::draw;

		if (move.type == Movetype::no_type || !pos.is_legal(move))
			continue;


		if (main_thread(pos) && root_node && elapsed > 3000)
			std::cout << "info depth " << depth
			<< " currmove " << uci::move_to_string(move)
			<< " currmovenumber " << moves_searched << std::endl;

		// Set move data
		auto hashOrKiller = (move == ttm) ||
			(move == stack->killers[0]) ||
			(move == stack->killers[1]) ||
			(move == stack->killers[2]) ||
			(move == stack->killers[3]);
		auto isPromotion = pos.is_promotion(move.type);
		auto isCapture =
			(move.type == Movetype::capture) ||
			(move.type == Movetype::ep) ||
			pos.is_cap_promotion(Movetype(move.type));
		auto isQuiet = move.type == Movetype::quiet;
		auto isEvasion = in_check;
		auto advancedPawnPush = (pos.piece_on(Square(move.t)) == Piece::pawn) &&
			(to_mv == white ? util::row(move.t) >= Row::r6 : util::row(move.t) <= Row::r3);
		auto quietFollowingCapture = (stack - 1)->curr_move.type == Movetype::capture && isQuiet;
		auto quietFollowup = (stack - 1)->curr_move.type == Movetype::quiet && isQuiet;
		auto captureFollowup = (stack - 1)->curr_move.type == Movetype::capture && isCapture;
		auto threatResponse = (stack->threat_move.type != Movetype::no_type && stack->threat_move.f == move.t) && isCapture;
		auto dangerousQuietCheck = isQuiet && pos.quiet_gives_dangerous_check(move);

		// 4. Skip moves with negative see scores
		if (isCapture &&
			!hashOrKiller &&
			!pvNode &&
			!isEvasion &&
			!isPromotion &&
			bestScore < alpha &&
			depth <= 1 &&
			moves_searched > 1 &&
			(SEE = pos.see(move)) < 0)
			continue;

		// Debug viz readout
		//{
		//	std::unique_lock<std::mutex> lock(search_mtx);
		//	std::cout << "moveReadout " <<
		//		"depth=" << depth <<
		//		" m=" << (pos.to_move() == white ? "W" : "B") << "|" <<
		//		SanPiece[pos.piece_on(Square(move.f))] << "|" <<
		//		util::col(move.f) << "|" << util::row(move.f) << "|" <<
		//		util::col(move.t) << "|" << util::row(move.t) << std::endl;
		//}
		
		pos.do_move(move);
		stack->curr_move = move;

		bool givesCheck = pos.in_check();
		int16 extensions = givesCheck;
		int16 reductions = 1;

		// 5. Reduce uninteresting quiet moves
		if (!pvNode &&
			!improving &&
			!hashOrKiller &&
			!isCapture &&
			!isEvasion &&
			!givesCheck &&
			!isPromotion &&
			!advancedPawnPush &&
			depth <= 2 &&
			bestScore <= alpha)
			reductions += 1;

		// 6. Extend likely interesting quiet moves 
		if (!pvNode &&
			!improving &&
			!hashOrKiller &&
			!isCapture &&
			depth <= 2 &&
			bestScore < alpha &&
			bestScore > mated_max_ply &&
			(dangerousQuietCheck || advancedPawnPush || threatResponse))
			extensions += 1;

		// 7. Reduce losing captures
		//if (isCapture &&
		//	!hashOrKiller &&
		//	!givesCheck &&
		//	!isPromotion &&
		//	!isEvasion &&
		//	bestScore < alpha &&
		//	!advancedPawnPush &&
		//	depth <= 1 &&
		//	SEE < 0)
		//	reductions += 1;

		// 8. Movecount pruning from Stockfish
		skipQuiets = moves_searched >= futility_move_count(improving, depth);

		// 9. Reduction if this position is being searched by another thread
		//if (is_searching(pos, move, pos.id()))
		//	reductions += 1;

		int16 newdepth = depth + extensions - reductions;
		(stack + 1)->pv = nullptr;

		Score score = Score::ninf;
		if (moves_searched < 3) {
			(stack + 1)->pv = pv;
			(stack + 1)->pv[0].set(A1, A1, Movetype::no_type);
			score = Score(newdepth <= 1 ? -qsearch<Nodetype::pv>(pos, -beta, -alpha, 0, stack + 1) :
				-search<Nodetype::pv>(pos, -beta, -alpha, newdepth - 1, stack + 1));
		}
		else {
			int16 LMR = newdepth;
			// Late move reduction for moves unlikely to raise alpha
			if (!threatResponse &&
				!hashOrKiller &&
				!dangerousQuietCheck &&
				!captureFollowup &&
				!advancedPawnPush &&
				!isPromotion &&
				!isEvasion &&
				!givesCheck &&
				!anyPawnsOn7th &&
				depth >= 3 &&
				bestScore <= alpha) {
				unsigned R = reduction(pvNode, improving, depth, moves_searched);
				LMR -= R;
			}

			score = Score(LMR <= 1 ? -qsearch<non_pv>(pos, -alpha - 1, -alpha, 0, stack + 1) :
				-search<non_pv>(pos, -alpha - 1, -alpha, LMR - 1, stack + 1));

			if (score > alpha) {
				(stack + 1)->pv = pv;
				(stack + 1)->pv[0].set(A1, A1, Movetype::no_type);

				score = Score(newdepth <= 1 ? -qsearch<Nodetype::pv>(pos, -beta, -alpha, 0, stack + 1) :
					-search<Nodetype::pv>(pos, -beta, -alpha, newdepth - 1, stack + 1));
			}
		}
		++moves_searched;

		if (move.type == Movetype::quiet)
			quiets.emplace_back(move);


		pos.undo_move(move);

		// return if stop requested - do not updated best move or pv
		if (UCI_SIGNALS.stop)
			return Score::draw;


		// root move update
		if (root_node) {
			auto& rm = *std::find(pos.root_moves.begin(), pos.root_moves.end(), move);

			if (moves_searched == 1 || score > alpha) {
				rm.score = score;
				rm.selDepth = selDepth;
				rm.pv.resize(1);
				for (Move* m = (stack + 1)->pv;; ++m) {
					if (m->f == m->t || m->type == Movetype::no_type)
						break;
					rm.pv.push_back(*m);
				}
			}
			else rm.score = Score::ninf;
		}

		if (score > bestScore) {
			bestScore = score;
			best_move = move;
			stack->best_move = move;

			if (score >= beta) {
				// Update mate killers and quiet move stats
				pos.stats_update(best_move,
					(stack - 1)->curr_move,
					depth, bestScore, quiets, stack->killers);
				break;
			}

			if (score > alpha) {

				if (pvNode)
					alpha = score;

				if (pvNode && !root_node)
					update_pv(stack->pv, move, (stack + 1)->pv);
			}
		}


		// Penalize captures failing to raise alpha
		//if (SEE >= 0 && !pv && score < alpha && move.f != move.t && move.type == Movetype::capture) {
		//	auto capturePenalty = 2 * depth;
		//	stack->capHistory[to_mv][move.f][move.t] -= capturePenalty;
		//}

	} // end moves loop




	unset_searching(pos, {});

	// Update best move stats
	auto bestMoveBonus = 2 * depth;
	if (bestScore >= alpha && bestScore < beta && best_move.f != best_move.t) {
		stack->bestMoveHistory->bm[to_mv][best_move.f][best_move.t] += bestMoveBonus;
	}



	if (moves_searched == 0) {
		return (in_check ? Score(Score::mated + root_dist) : Score::draw);
	}

	Bound bound = (bestScore >= beta ? bound_low :
		pvNode && (best_move.type != Movetype::no_type) ? bound_exact : bound_high);
	ttable.save(pos.key(), depth, U8(bound), stack->ply, best_move, bestScore, pvNode);

	return bestScore;
}